

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  string asStack_38 [32];
  
  ::std::__cxx11::string::string(asStack_38,(string *)this);
  ::std::__cxx11::string::_M_assign((string *)other);
  ::std::__cxx11::string::~string(asStack_38);
  (other->super_OptionBase<CLI::Option>).required_ = this->required_;
  Option::ignore_case<CLI::App>(other,this->ignore_case_);
  Option::ignore_underscore<CLI::App>(other,this->ignore_underscore_);
  (other->super_OptionBase<CLI::Option>).configurable_ = this->configurable_;
  Option::multi_option_policy(other,this->multi_option_policy_);
  return;
}

Assistant:

void copy_to(T *other) const {
        other->group(group_);
        other->required(required_);
        other->ignore_case(ignore_case_);
        other->ignore_underscore(ignore_underscore_);
        other->configurable(configurable_);
        other->multi_option_policy(multi_option_policy_);
    }